

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-spbset.c
# Opt level: O2

uint_spbset_chunk * uint_spbset_get_chunk(uint_spbset *bset,uint i,_Bool grow)

{
  uint uVar1;
  curl_uint64_t cVar2;
  curl_uint64_t cVar3;
  curl_uint64_t cVar4;
  undefined4 uVar5;
  uint_spbset_chunk *puVar6;
  uint_spbset_chunk *puVar7;
  uint uVar8;
  uint_spbset_chunk *puVar9;
  
  if (bset == (uint_spbset *)0x0) {
    return (uint_spbset_chunk *)0x0;
  }
  uVar8 = i & 0xffffff00;
  puVar6 = &bset->head;
  puVar9 = (uint_spbset_chunk *)0x0;
  while (puVar7 = puVar6, puVar7 != (uint_spbset_chunk *)0x0) {
    uVar1 = puVar7->offset;
    if (uVar1 == uVar8) {
      return puVar7;
    }
    if (uVar8 <= uVar1 && uVar1 != uVar8) break;
    puVar9 = puVar7;
    puVar6 = puVar7->next;
  }
  if ((grow) &&
     (puVar6 = (uint_spbset_chunk *)(*Curl_ccalloc)(1,0x30), puVar6 != (uint_spbset_chunk *)0x0)) {
    if (puVar9 == (uint_spbset_chunk *)0x0) {
      puVar9 = (bset->head).next;
      cVar2 = (bset->head).slots[0];
      cVar3 = (bset->head).slots[1];
      cVar4 = (bset->head).slots[2];
      uVar1 = (bset->head).offset;
      uVar5 = *(undefined4 *)&(bset->head).field_0x2c;
      puVar6->slots[3] = (bset->head).slots[3];
      puVar6->offset = uVar1;
      *(undefined4 *)&puVar6->field_0x2c = uVar5;
      puVar6->slots[1] = cVar3;
      puVar6->slots[2] = cVar4;
      puVar6->next = puVar9;
      puVar6->slots[0] = cVar2;
      (bset->head).slots[0] = 0;
      (bset->head).slots[1] = 0;
      (bset->head).slots[2] = 0;
      (bset->head).slots[3] = 0;
      *(undefined8 *)&(bset->head).offset = 0;
    }
    else {
      puVar6->next = puVar9->next;
      bset = (uint_spbset *)puVar9;
    }
    (bset->head).next = puVar6;
    puVar6->offset = uVar8;
    return puVar6;
  }
  return (uint_spbset_chunk *)0x0;
}

Assistant:

static struct uint_spbset_chunk *
uint_spbset_get_chunk(struct uint_spbset *bset, unsigned int i, bool grow)
{
  struct uint_spbset_chunk *chunk, **panchor = NULL;
  unsigned int i_offset = (i & ~CURL_UINT_SPBSET_CH_MASK);

  if(!bset)
    return NULL;

  for(chunk = &bset->head; chunk;
      panchor = &chunk->next, chunk = chunk->next) {
    if(chunk->offset == i_offset) {
      return chunk;
    }
    else if(chunk->offset > i_offset) {
      /* need new chunk here */
      chunk = NULL;
      break;
    }
  }

  if(!grow)
    return NULL;

  /* need a new one */
  chunk = calloc(1, sizeof(*chunk));
  if(!chunk)
    return NULL;

  if(panchor) {  /* insert between panchor and *panchor */
    chunk->next = *panchor;
    *panchor = chunk;
  }
  else {  /* prepend to head, switching places */
    memcpy(chunk, &bset->head, sizeof(*chunk));
    memset(&bset->head, 0, sizeof(bset->head));
    bset->head.next = chunk;
  }
  chunk->offset = i_offset;
  return chunk;
}